

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O3

bool el::Configurations::Parser::parseFromText
               (string *configurationsString,Configurations *sender,Configurations *base)

{
  char cVar1;
  bool bVar2;
  istream *piVar3;
  ostream *poVar4;
  Level currLevel;
  string line;
  string currLevelStr;
  string currConfigStr;
  stringstream internalInfoStream;
  stringstream ss;
  Level local_3c4;
  string local_3c0;
  char *local_3a0;
  long local_398;
  char local_390 [16];
  string local_380;
  string local_360;
  stringstream local_340 [16];
  ostream local_330 [112];
  ios_base local_2c0 [264];
  long local_1b8 [16];
  ios_base local_138 [264];
  
  setFromBase(sender,base);
  std::__cxx11::stringstream::stringstream
            ((stringstream *)local_1b8,(string *)configurationsString,_S_out|_S_in);
  local_3c0._M_dataplus._M_p = (pointer)&local_3c0.field_2;
  bVar2 = false;
  local_3c0._M_string_length = 0;
  local_3c0.field_2._M_local_buf[0] = '\0';
  local_3c4 = Unknown;
  local_360._M_dataplus._M_p = (pointer)&local_360.field_2;
  local_360._M_string_length = 0;
  local_360.field_2._M_local_buf[0] = '\0';
  local_380._M_dataplus._M_p = (pointer)&local_380.field_2;
  local_380._M_string_length = 0;
  local_380.field_2._M_local_buf[0] = '\0';
  while( true ) {
    cVar1 = std::ios::widen((char)*(undefined8 *)(local_1b8[0] + -0x18) +
                            (char)(stringstream *)local_1b8);
    piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)local_1b8,(string *)&local_3c0,cVar1);
    if (((byte)piVar3[*(long *)(*(long *)piVar3 + -0x18) + 0x20] & 5) != 0) break;
    bVar2 = parseLine(&local_3c0,&local_360,&local_380,&local_3c4,sender);
    if (!bVar2) {
      std::__cxx11::stringstream::stringstream(local_340);
      std::__ostream_insert<char,std::char_traits<char>>
                (local_330,"Unable to parse configuration line: ",0x24);
      std::__ostream_insert<char,std::char_traits<char>>
                (local_330,local_3c0._M_dataplus._M_p,local_3c0._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"ASSERTION FAILURE FROM EASYLOGGING++ (LINE: ",0x2c);
      poVar4 = (ostream *)std::ostream::operator<<(&std::cerr,0x168);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,") [parsedSuccessfully",0x15);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"] WITH MESSAGE \"",0x10);
      std::__cxx11::stringbuf::str();
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_3a0,local_398);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\"",1);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
      std::ostream::put((char)poVar4);
      std::ostream::flush();
      if (local_3a0 != local_390) {
        operator_delete(local_3a0);
      }
      std::__cxx11::stringstream::~stringstream(local_340);
      std::ios_base::~ios_base(local_2c0);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_380._M_dataplus._M_p != &local_380.field_2) {
    operator_delete(local_380._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_360._M_dataplus._M_p != &local_360.field_2) {
    operator_delete(local_360._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c0._M_dataplus._M_p != &local_3c0.field_2) {
    operator_delete(local_3c0._M_dataplus._M_p);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
  std::ios_base::~ios_base(local_138);
  return bVar2;
}

Assistant:

bool Configurations::Parser::parseFromText(const std::string& configurationsString, Configurations* sender,
    Configurations* base) {
  sender->setFromBase(base);
  bool parsedSuccessfully = false;
  std::stringstream ss(configurationsString);
  std::string line = std::string();
  Level currLevel = Level::Unknown;
  std::string currConfigStr = std::string();
  std::string currLevelStr = std::string();
  while (std::getline(ss, line)) {
    parsedSuccessfully = parseLine(&line, &currConfigStr, &currLevelStr, &currLevel, sender);
    ELPP_ASSERT(parsedSuccessfully, "Unable to parse configuration line: " << line);
  }
  return parsedSuccessfully;
}